

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

BatchnormLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_batchnorm(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0xa0) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0xa0;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.batchnorm_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::BatchnormLayerParams>
                   (arena);
    (this->layer_).batchnorm_ = (BatchnormLayerParams *)LVar2;
  }
  return (BatchnormLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::BatchnormLayerParams* NeuralNetworkLayer::_internal_mutable_batchnorm() {
  if (!_internal_has_batchnorm()) {
    clear_layer();
    set_has_batchnorm();
    layer_.batchnorm_ = CreateMaybeMessage< ::CoreML::Specification::BatchnormLayerParams >(GetArenaForAllocation());
  }
  return layer_.batchnorm_;
}